

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoTriangle::Jacobian
          (TPZGeoTriangle *this,TPZFMatrix<double> *coord,TPZVec<double> *param,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  int64_t iVar1;
  uint uVar2;
  int i;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZFNMatrix<6,_double> VecMatrix;
  TPZFNMatrix<6,_double> dphi;
  TPZFNMatrix<6,_double> axest;
  TPZFNMatrix<3,_double> phi;
  double local_368;
  TPZFMatrix<double> local_338;
  double local_2a8 [7];
  TPZFMatrix<double> local_270;
  double local_1e0 [7];
  TPZFMatrix<double> local_1a8;
  double local_118 [7];
  TPZFMatrix<double> local_e0;
  double local_50 [4];
  
  iVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  (*(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacobian,2,2);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (axes,2,3);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,2,2);
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186ce28;
  local_e0.fSize = 3;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186cb38;
  local_270.fElem = local_1e0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018ab3b0;
  local_270.fSize = 6;
  local_270.fGiven = local_270.fElem;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_270.fWork.fStore = (double *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ab0c0;
  local_1a8.fElem = local_118;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018ab3b0;
  local_1a8.fSize = 6;
  local_1a8.fGiven = local_1a8.fElem;
  TPZVec<int>::TPZVec(&local_1a8.fPivot.super_TPZVec<int>,0);
  local_1a8.fPivot.super_TPZVec<int>.fStore = local_1a8.fPivot.fExtAlloc;
  local_1a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1a8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1a8.fWork.fStore = (double *)0x0;
  local_1a8.fWork.fNElements = 0;
  local_1a8.fWork.fNAlloc = 0;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ab0c0;
  (*(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (jacobian);
  pztopology::TPZTriangle::TShape<double>(param,&local_e0,&local_270);
  local_338.fElem = local_2a8;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018ab3b0;
  local_338.fSize = 6;
  local_338.fGiven = local_338.fElem;
  TPZVec<int>::TPZVec(&local_338.fPivot.super_TPZVec<int>,0);
  local_338.fPivot.super_TPZVec<int>.fStore = local_338.fPivot.fExtAlloc;
  local_338.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_338.fPivot.super_TPZVec<int>.fNElements = 0;
  local_338.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_338.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_338.fWork.fStore = (double *)0x0;
  local_338.fWork.fNElements = 0;
  local_338.fWork.fNAlloc = 0;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ab0c0;
  TPZFMatrix<double>::operator=(&local_338,0.0);
  uVar2 = (uint)iVar1;
  lVar3 = 0;
  do {
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        (*(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(coord,uVar5,lVar3);
        if ((local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
           (local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_338.fElem[uVar5] =
             extraout_XMM0_Qa *
             local_270.fElem[local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3] +
             local_338.fElem[uVar5];
        (*(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(coord,uVar5,lVar3);
        if ((local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
           (local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
           (local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_338.fElem[local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar5] =
             extraout_XMM0_Qa_00 *
             local_270.fElem[local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 1]
             + local_338.fElem[local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar5];
        uVar5 = uVar5 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar5);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  TPZFMatrix<double>::GramSchmidt(&local_338,&local_1a8,jacobian);
  TPZFMatrix<double>::Transpose(&local_1a8,&axes->super_TPZMatrix<double>);
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar3 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar3 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *detjac = *jacobian->fElem * jacobian->fElem[lVar3 + 1] -
            jacobian->fElem[1] *
            jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow];
  local_368 = 0.0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
         ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (local_368 <=
          ABS(jacobian->fElem
              [(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar4 + lVar3])) {
        local_368 = ABS(jacobian->fElem
                        [(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar4 +
                         lVar3]);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  if ((local_368 < 1e-12) || (ABS(*detjac / (local_368 * local_368)) < 1e-12)) {
    *detjac = 1e-12;
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *jacinv->fElem =
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
       *jacobian->fElem / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] =
       -jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((1 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (0 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    jacinv->fElem[1] = -jacobian->fElem[1] / *detjac;
    TPZFMatrix<double>::~TPZFMatrix(&local_338,&PTR_PTR_018ab378);
    TPZFMatrix<double>::~TPZFMatrix(&local_1a8,&PTR_PTR_018ab378);
    TPZFMatrix<double>::~TPZFMatrix(&local_270,&PTR_PTR_018ab378);
    TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_0186cdf0);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZGeoTriangle::Jacobian(const TPZFMatrix<REAL> & coord, TPZVec<REAL> &param,TPZFMatrix<REAL> &jacobian,TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv){
		
        int spacedim = coord.Rows();
        jacobian.Resize(2,2); axes.Resize(2,3); jacinv.Resize(2,2);
		TPZFNMatrix<3> phi(3,1);
        TPZFNMatrix<6> dphi(2,3),axest(3,2);
		jacobian.Zero();
		Shape(param,phi,dphi);
        TPZFNMatrix<6> VecMatrix(3,2,0.);
        for(int i = 0; i < 3; i++) {
			for(int j = 0; j < spacedim; j++) {
				VecMatrix(j,0) += coord.GetVal(j,i)*dphi(0,i);
				VecMatrix(j,1) += coord.GetVal(j,i)*dphi(1,i);
			}
        }
        VecMatrix.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
		detjac = jacobian(0,0)*jacobian(1,1)-jacobian(1,0)*jacobian(0,1);
    REAL maxjac = 0.;
    for (int i=0; i<2; i++) {
      for (int j=0; j<2; j++) {
        maxjac = Max(maxjac,fabs(jacobian(i,j)));
      }
    }
        if(IsZero(maxjac) || IsZero(detjac/(maxjac*maxjac)))
		{
#ifdef PZDEBUG
			std::stringstream sout;
			sout << "Singular Jacobian " << detjac;
			LOGPZ_ERROR(logger, sout.str())
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) =  jacobian(1,1)/detjac;
        jacinv(1,1) =  jacobian(0,0)/detjac;
        jacinv(0,1) = -jacobian(0,1)/detjac;
        jacinv(1,0) = -jacobian(1,0)/detjac;
	}